

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

double __thiscall ON_Xform::GetSurfaceNormalXform(ON_Xform *this,ON_Xform *N_xform)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  double p;
  double d;
  double mrofx [4] [4];
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double local_40;
  double local_38;
  
  N_xform->m_xform[0][2] = this->m_xform[0][2];
  dVar4 = this->m_xform[0][1];
  N_xform->m_xform[0][0] = this->m_xform[0][0];
  N_xform->m_xform[0][1] = dVar4;
  N_xform->m_xform[0][3] = 0.0;
  dVar4 = this->m_xform[1][1];
  N_xform->m_xform[1][0] = this->m_xform[1][0];
  N_xform->m_xform[1][1] = dVar4;
  N_xform->m_xform[1][2] = this->m_xform[1][2];
  N_xform->m_xform[1][3] = 0.0;
  dVar4 = this->m_xform[2][1];
  N_xform->m_xform[2][0] = this->m_xform[2][0];
  N_xform->m_xform[2][1] = dVar4;
  N_xform->m_xform[2][2] = this->m_xform[2][2];
  N_xform->m_xform[2][3] = 0.0;
  N_xform->m_xform[3][0] = 0.0;
  N_xform->m_xform[3][1] = 0.0;
  N_xform->m_xform[3][2] = 0.0;
  N_xform->m_xform[3][3] = 1.0;
  local_90 = 0.0;
  local_98 = 0.0;
  iVar1 = Inv((double *)N_xform,(double (*) [4])&local_88,&local_90,&local_98);
  uVar2 = 0;
  uVar3 = 0;
  if (iVar1 == 4) {
    dVar4 = ABS(local_90);
    if (((3.308722450213671e-24 < dVar4) && (dVar4 * 3.308722450213671e-24 < 1.0)) &&
       (dVar4 * 2.220446049250313e-16 < ABS(local_98))) {
      N_xform->m_xform[0][0] = local_88;
      N_xform->m_xform[0][1] = local_68;
      N_xform->m_xform[0][2] = local_48;
      N_xform->m_xform[1][0] = local_80;
      N_xform->m_xform[1][1] = local_60;
      N_xform->m_xform[1][2] = local_40;
      N_xform->m_xform[2][0] = local_78;
      N_xform->m_xform[2][1] = local_58;
      N_xform->m_xform[2][2] = local_38;
      uVar2 = SUB84(local_90,0);
      uVar3 = (undefined4)((ulong)local_90 >> 0x20);
    }
  }
  return (double)CONCAT44(uVar3,uVar2);
}

Assistant:

double ON_Xform::GetSurfaceNormalXform( ON_Xform& N_xform ) const
{
  // since were are transforming vectors, we don't need
  // the translation column or bottom row.
  memcpy(&N_xform.m_xform[0][0],&m_xform[0][0], 3*sizeof(N_xform.m_xform[0][0]) );
  N_xform.m_xform[0][3] = 0.0;
  memcpy(&N_xform.m_xform[1][0],&m_xform[1][0], 3*sizeof(N_xform.m_xform[0][0]) );
  N_xform.m_xform[1][3] = 0.0;
  memcpy(&N_xform.m_xform[2][0],&m_xform[2][0], 3*sizeof(N_xform.m_xform[0][0]) );
  N_xform.m_xform[2][3] = 0.0;
  N_xform.m_xform[3][0] = 0.0;
  N_xform.m_xform[3][1] = 0.0;
  N_xform.m_xform[3][2] = 0.0;
  N_xform.m_xform[3][3] = 1.0;

  double mrofx[4][4], d = 0.0, p = 0.0;
  double dtol = ON_SQRT_EPSILON*ON_SQRT_EPSILON*ON_SQRT_EPSILON;
  if ( 4 == Inv( &N_xform.m_xform[0][0], mrofx, &d, &p ) 
       && fabs(d) > dtol 
       && fabs(d)*dtol < 1.0
       && fabs(p) > ON_EPSILON*fabs(d)
     )
  {
    // Set N_xform = transpose of mrofx (only upper 3x3 matters)
    N_xform.m_xform[0][0] = mrofx[0][0];
    N_xform.m_xform[0][1] = mrofx[1][0]; 
    N_xform.m_xform[0][2] = mrofx[2][0];

    N_xform.m_xform[1][0] = mrofx[0][1];
    N_xform.m_xform[1][1] = mrofx[1][1];
    N_xform.m_xform[1][2] = mrofx[2][1];

    N_xform.m_xform[2][0] = mrofx[0][2];
    N_xform.m_xform[2][1] = mrofx[1][2];
    N_xform.m_xform[2][2] = mrofx[2][2];
  }
  else
  {
    d = 0.0;
  }
  return d;
}